

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

void __thiscall
QHostInfoLookupManager::lookupFinished(QHostInfoLookupManager *this,QHostInfoRunnable *r)

{
  long in_FS_OFFSET;
  QHostInfoRunnable *local_30;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &this->mutex;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = r;
  QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
  local_28[8] = true;
  if (this->wasDeleted == false) {
    QtPrivate::sequential_erase_one<QList<QHostInfoRunnable*>,QHostInfoRunnable*>
              (&this->currentLookups,&local_30);
    QList<QHostInfoRunnable_*>::append(&this->finishedLookups,local_30);
    rescheduleWithMutexHeld(this);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoLookupManager::lookupFinished(QHostInfoRunnable *r)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return;

#if QT_CONFIG(thread)
    currentLookups.removeOne(r);
#endif
    finishedLookups.append(r);
    rescheduleWithMutexHeld();
}